

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_MatchAndModifiedInterleaveProperly_Test::TestBody
          (MatchingTest_MatchAndModifiedInterleaveProperly_Test *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  char *message;
  AssertHelper local_408;
  Message local_400;
  string local_3f8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar;
  MessageDifferencer differencer;
  string_view local_208;
  string_view local_1f8;
  string_view local_1e8;
  string_view local_1d8;
  FieldDescriptor *local_1c8;
  FieldDescriptor *double_nested_desc;
  FieldDescriptor *double_nested_key;
  FieldDescriptor *nested_desc;
  FieldDescriptor *nested_key;
  FieldDescriptor *desc;
  TestField *field;
  Item *item;
  undefined1 local_180 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MatchingTest_MatchAndModifiedInterleaveProperly_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_180);
  pDVar2 = proto2_unittest::TestDiffMessage::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"item");
  nested_key = Descriptor::FindFieldByName(pDVar2,local_1d8);
  pDVar2 = FieldDescriptor::message_type(nested_key);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,"a");
  nested_desc = Descriptor::FindFieldByName(pDVar2,local_1e8);
  pDVar2 = FieldDescriptor::message_type(nested_key);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f8,"rm");
  double_nested_key = Descriptor::FindFieldByName(pDVar2,local_1f8);
  pDVar2 = FieldDescriptor::message_type(double_nested_key);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_208,"c");
  double_nested_desc = Descriptor::FindFieldByName(pDVar2,local_208);
  pDVar2 = FieldDescriptor::message_type(double_nested_key);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&differencer.unpack_any_field_,"rc"
            );
  local_1c8 = Descriptor::FindFieldByName(pDVar2,stack0xfffffffffffffde8);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar.message_);
  util::MessageDifferencer::TreatAsMap
            ((MessageDifferencer *)&gtest_ar.message_,nested_key,nested_desc);
  util::MessageDifferencer::TreatAsMap
            ((MessageDifferencer *)&gtest_ar.message_,double_nested_key,double_nested_desc);
  util::MessageDifferencer::TreatAsSet((MessageDifferencer *)&gtest_ar.message_,local_1c8);
  field = (TestField *)
          proto2_unittest::TestDiffMessage::add_item
                    ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  proto2_unittest::TestDiffMessage_Item::set_a((TestDiffMessage_Item *)field,1);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,2);
  proto2_unittest::TestField::add_rc((TestField *)desc,3);
  proto2_unittest::TestField::add_rc((TestField *)desc,4);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,5);
  proto2_unittest::TestField::add_rc((TestField *)desc,6);
  proto2_unittest::TestField::add_rc((TestField *)desc,7);
  proto2_unittest::TestField::add_rc((TestField *)desc,8);
  field = (TestField *)
          proto2_unittest::TestDiffMessage::add_item
                    ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  proto2_unittest::TestDiffMessage_Item::set_a((TestDiffMessage_Item *)field,9);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,10);
  proto2_unittest::TestField::add_rc((TestField *)desc,0xb);
  proto2_unittest::TestField::add_rc((TestField *)desc,0xc);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,0xd);
  field = (TestField *)proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage_Item::set_a((TestDiffMessage_Item *)field,1);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,5);
  proto2_unittest::TestField::add_rc((TestField *)desc,8);
  proto2_unittest::TestField::add_rc((TestField *)desc,8);
  proto2_unittest::TestField::add_rc((TestField *)desc,6);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,3);
  proto2_unittest::TestField::add_rc((TestField *)desc,2);
  proto2_unittest::TestField::add_rc((TestField *)desc,4);
  field = (TestField *)proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage_Item::set_a((TestDiffMessage_Item *)field,9);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,10);
  proto2_unittest::TestField::add_rc((TestField *)desc,0xc);
  proto2_unittest::TestField::add_rc((TestField *)desc,0xb);
  desc = (FieldDescriptor *)
         proto2_unittest::TestDiffMessage_Item::add_rm((TestDiffMessage_Item *)field);
  proto2_unittest::TestField::set_c((TestField *)desc,0xd);
  protobuf::(anonymous_namespace)::MatchingTest::RunWithResult_abi_cxx11_
            (&local_3f8,this,(MessageDifferencer *)&gtest_ar.message_,
             (Message *)((long)&msg2.field_0 + 0xa0),(Message *)local_180,false);
  testing::internal::EqHelper::
  Compare<char[922],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_3d8,
             "\"matched: item[0].a : 1\\n\" \"matched: item[0].rm[1].c -> item[0].rm[0].c : 5\\n\" \"moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 6\\n\" \"moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 8\\n\" \"added: item[0].rm[0].rc[1]: 8\\n\" \"deleted: item[0].rm[1].rc[1]: 7\\n\" \"modified: item[0].rm[1] -> item[0].rm[0]: { c: 5 rc: 6 rc: 7 rc: 8 } ->\" \" { c: 5 rc: 8 rc: 8 rc: 6 }\\n\" \"added: item[0].rm[1]: { c: 3 rc: 2 rc: 4 }\\n\" \"deleted: item[0].rm[0]: { c: 2 rc: 3 rc: 4 }\\n\" \"modified: item[0]: { a: 1 rm { c: 2 rc: 3 rc: 4 }\" \" rm { c: 5 rc: 6 rc: 7 rc: 8 } } ->\" \" { a: 1 rm { c: 5 rc: 8 rc: 8 rc: 6 }\" \" rm { c: 3 rc: 2 rc: 4 } }\\n\" \"matched: item[1].a : 9\\n\" \"matched: item[1].rm[0].c : 10\\n\" \"moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 11\\n\" \"moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[0] : 12\\n\" \"matched: item[1].rm[0] : { c: 10 rc: 11 rc: 12 }\\n\" \"matched: item[1].rm[1].c : 13\\n\" \"matched: item[1].rm[1] : { c: 13 }\\n\" \"matched: item[1] : { a: 9 rm { c: 10 rc: 11 rc: 12 } rm { c: 13 } }\\n\""
             ,"RunWithResult(&differencer, msg1, msg2, false)",
             (char (*) [922])
             "matched: item[0].a : 1\nmatched: item[0].rm[1].c -> item[0].rm[0].c : 5\nmoved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 6\nmoved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 8\nadded: item[0].rm[0].rc[1]: 8\ndeleted: item[0].rm[1].rc[1]: 7\nmodified: item[0].rm[1] -> item[0].rm[0]: { c: 5 rc: 6 rc: 7 rc: 8 } -> { c: 5 rc: 8 rc: 8 rc: 6 }\nadded: item[0].rm[1]: { c: 3 rc: 2 rc: 4 }\ndeleted: item[0].rm[0]: { c: 2 rc: 3 rc: 4 }\nmodified: item[0]: { a: 1 rm { c: 2 rc: 3 rc: 4 } rm { c: 5 rc: 6 rc: 7 rc: 8 } } -> { a: 1 rm { c: 5 rc: 8 rc: 8 rc: 6 } rm { c: 3 rc: 2 rc: 4 } }\nmatched: item[1].a : 9\nmatched: item[1].rm[0].c : 10\nmoved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 11\nmoved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[0] : 12\nmatched: item[1].rm[0] : { c: 10 rc: 11 rc: 12 }\nmatched: item[1].rm[1].c : 13\nmatched: item[1].rm[1] : { c: 13 }\nmatched: item[1] : { a: 9 rm { c: 10 rc: 11 rc: 12 } rm { c: 13 } }\n"
             ,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1078,message);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar.message_);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST_F(MatchingTest, MatchAndModifiedInterleaveProperly) {
  proto2_unittest::TestDiffMessage msg1, msg2;
  proto2_unittest::TestDiffMessage::Item* item;
  proto2_unittest::TestField* field;

  const FieldDescriptor* desc;
  const FieldDescriptor* nested_key;
  const FieldDescriptor* nested_desc;
  const FieldDescriptor* double_nested_key;
  const FieldDescriptor* double_nested_desc;
  desc = msg1.GetDescriptor()->FindFieldByName("item");
  nested_key = desc->message_type()->FindFieldByName("a");
  nested_desc = desc->message_type()->FindFieldByName("rm");
  double_nested_key = nested_desc->message_type()->FindFieldByName("c");
  double_nested_desc = nested_desc->message_type()->FindFieldByName("rc");

  MessageDifferencer differencer;
  differencer.TreatAsMap(desc, nested_key);
  differencer.TreatAsMap(nested_desc, double_nested_key);
  differencer.TreatAsSet(double_nested_desc);

  item = msg1.add_item();
  item->set_a(1);
  field = item->add_rm();
  field->set_c(2);
  field->add_rc(3);
  field->add_rc(4);
  field = item->add_rm();
  field->set_c(5);
  field->add_rc(6);
  field->add_rc(7);
  field->add_rc(8);
  item = msg1.add_item();
  item->set_a(9);
  field = item->add_rm();
  field->set_c(10);
  field->add_rc(11);
  field->add_rc(12);
  field = item->add_rm();
  field->set_c(13);

  item = msg2.add_item();
  item->set_a(1);
  field = item->add_rm();
  field->set_c(5);
  field->add_rc(8);
  field->add_rc(8);
  field->add_rc(6);
  field = item->add_rm();
  field->set_c(3);
  field->add_rc(2);
  field->add_rc(4);
  item = msg2.add_item();
  item->set_a(9);
  field = item->add_rm();
  field->set_c(10);
  field->add_rc(12);
  field->add_rc(11);
  field = item->add_rm();
  field->set_c(13);

  EXPECT_EQ(
      "matched: item[0].a : 1\n"
      "matched: item[0].rm[1].c -> item[0].rm[0].c : 5\n"
      "moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 6\n"
      "moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 8\n"
      "added: item[0].rm[0].rc[1]: 8\n"
      "deleted: item[0].rm[1].rc[1]: 7\n"
      "modified: item[0].rm[1] -> item[0].rm[0]: { c: 5 rc: 6 rc: 7 rc: 8 } ->"
      " { c: 5 rc: 8 rc: 8 rc: 6 }\n"
      "added: item[0].rm[1]: { c: 3 rc: 2 rc: 4 }\n"
      "deleted: item[0].rm[0]: { c: 2 rc: 3 rc: 4 }\n"
      "modified: item[0]: { a: 1 rm { c: 2 rc: 3 rc: 4 }"
      " rm { c: 5 rc: 6 rc: 7 rc: 8 } } ->"
      " { a: 1 rm { c: 5 rc: 8 rc: 8 rc: 6 }"
      " rm { c: 3 rc: 2 rc: 4 } }\n"
      "matched: item[1].a : 9\n"
      "matched: item[1].rm[0].c : 10\n"
      "moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 11\n"
      "moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[0] : 12\n"
      "matched: item[1].rm[0] : { c: 10 rc: 11 rc: 12 }\n"
      "matched: item[1].rm[1].c : 13\n"
      "matched: item[1].rm[1] : { c: 13 }\n"
      "matched: item[1] : { a: 9 rm { c: 10 rc: 11 rc: 12 } rm { c: 13 } }\n",
      RunWithResult(&differencer, msg1, msg2, false));
}